

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_close_twice_open_filename.c
# Opt level: O0

void test_archive_read_close_twice_open_filename(void)

{
  archive *a_00;
  undefined4 unaff_retaddr;
  wchar_t unaff_retaddr_00;
  char *in_stack_00000008;
  archive *a;
  char *in_stack_00000018;
  void *in_stack_00000020;
  archive *in_stack_00000028;
  void *in_stack_00000030;
  wchar_t in_stack_00000038;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar1;
  uint in_stack_fffffffffffffff4;
  
  a_00 = archive_read_new();
  archive_read_support_format_empty(in_stack_00000028);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x131f46,in_stack_00000020);
  archive_read_open_filename
            ((archive *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x131f85,in_stack_00000020);
  archive_errno(a_00);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),0,
                      (char *)0x131fbd,in_stack_00000020);
  archive_error_string(a_00);
  uVar1 = 0;
  assertion_equal_string
            (in_stack_00000018,a._4_4_,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,in_stack_00000038)
  ;
  archive_read_close((archive *)0x132009);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x132037,
                      in_stack_00000020);
  archive_errno(a_00);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x13206f,
                      in_stack_00000020);
  archive_error_string(a_00);
  uVar1 = 0;
  assertion_equal_string
            (in_stack_00000018,a._4_4_,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,in_stack_00000038)
  ;
  archive_read_close((archive *)0x1320bb);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x1320e9,
                      in_stack_00000020);
  archive_errno(a_00);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x132121,
                      in_stack_00000020);
  archive_error_string(a_00);
  uVar1 = 0;
  assertion_equal_string
            (in_stack_00000018,a._4_4_,in_stack_00000008,
             (char *)CONCAT44(unaff_retaddr_00,unaff_retaddr),(char *)a_00,
             (char *)((ulong)in_stack_fffffffffffffff4 << 0x20),in_stack_00000030,in_stack_00000038)
  ;
  archive_read_free((archive *)0x13216d);
  assertion_equal_int(in_stack_00000008,unaff_retaddr_00,(longlong)a_00,
                      (char *)CONCAT44(in_stack_fffffffffffffff4,uVar1),0,(char *)0x13219b,
                      in_stack_00000020);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_close_twice_open_filename)
{
	struct archive* a = archive_read_new();

	assertEqualInt(ARCHIVE_OK, archive_read_support_format_empty(a));
	assertEqualInt(ARCHIVE_OK, archive_read_open_filename(a, 0, 0));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}